

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

void depthsbits_create(stagewise_poly *poly)

{
  uint64_t i;
  uchar *puVar1;
  ulong uVar2;
  
  puVar1 = calloc_or_throw<unsigned_char>(2L << ((byte)poly->all->num_bits & 0x3f));
  poly->depthsbits = puVar1;
  for (uVar2 = 0; uVar2 < (ulong)(2L << ((byte)poly->all->num_bits & 0x3f)); uVar2 = uVar2 + 2) {
    poly->depthsbits[uVar2] = '\x7f';
    poly->depthsbits[uVar2 + 1] = 0x80;
  }
  return;
}

Assistant:

void depthsbits_create(stagewise_poly &poly)
{
  poly.depthsbits = calloc_or_throw<uint8_t>(2 * poly.all->length());
  for (uint64_t i = 0; i < poly.all->length() * 2; i += 2)
  {
    poly.depthsbits[i] = default_depth;
    poly.depthsbits[i + 1] = indicator_bit;
  }
}